

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandGenFsm(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *FileName;
  int fVerbose;
  int ProbO;
  int ProbI;
  int nLines;
  int nStates;
  int nOuts;
  int nIns;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  nStates = 0x1e;
  nLines = 1;
  ProbI = 0x14;
  ProbO = 100;
  fVerbose = 10;
  FileName._4_4_ = 100;
  bVar1 = false;
  Extra_UtilGetoptReset();
LAB_002796bb:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"IOSLPQvh");
    if (iVar2 == -1) {
      if (argc == globalUtilOptind + 1) {
        if ((((0 < nStates) && (0 < ProbI)) && (0 < ProbO)) &&
           ((0 < fVerbose && (0 < (int)FileName._4_4_)))) {
          Abc_GenFsm(argv[globalUtilOptind],nStates,nLines,ProbI,ProbO,fVerbose,FileName._4_4_);
          return 0;
        }
        Abc_Print(-1,
                  "The number of inputs. states, lines, and probablity should be positive integers.\n"
                 );
      }
      goto LAB_002799ff;
    }
    switch(iVar2) {
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_002799ff;
      }
      nStates = atoi(argv[globalUtilOptind]);
      uVar3 = nStates;
      break;
    default:
      goto LAB_002799ff;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_002799ff;
      }
      ProbO = atoi(argv[globalUtilOptind]);
      uVar3 = ProbO;
      break;
    case 0x4f:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-O\" should be followed by an integer.\n");
        goto LAB_002799ff;
      }
      nLines = atoi(argv[globalUtilOptind]);
      uVar3 = nLines;
      break;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_002799ff;
      }
      fVerbose = atoi(argv[globalUtilOptind]);
      uVar3 = fVerbose;
      break;
    case 0x51:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-Q\" should be followed by an integer.\n");
        goto LAB_002799ff;
      }
      FileName._4_4_ = atoi(argv[globalUtilOptind]);
      uVar3 = FileName._4_4_;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_002799ff;
      }
      ProbI = atoi(argv[globalUtilOptind]);
      uVar3 = ProbI;
      break;
    case 0x68:
      goto LAB_002799ff;
    case 0x76:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_002796bb;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar3 < 0) {
LAB_002799ff:
      Abc_Print(-2,"usage: genfsm [-IOSLPQ num] [-vh] <file>\n");
      Abc_Print(-2,"\t         generates random FSM in KISS format\n");
      Abc_Print(-2,"\t-I num : the number of input variables [default = %d]\n",(ulong)(uint)nStates)
      ;
      Abc_Print(-2,"\t-O num : the number of output variables [default = %d]\n",(ulong)(uint)nLines)
      ;
      Abc_Print(-2,"\t-S num : the number of state variables [default = %d]\n",(ulong)(uint)ProbI);
      Abc_Print(-2,"\t-L num : the number of lines (product terms) [default = %d]\n",
                (ulong)(uint)ProbO);
      Abc_Print(-2,
                "\t-P num : percentage propability of a variable present in the input cube [default = %d]\n"
                ,(ulong)(uint)fVerbose);
      Abc_Print(-2,
                "\t-Q num : percentage propability of a variable present in the output cube [default = %d]\n"
                ,(ulong)FileName._4_4_);
      pcVar4 = "no";
      if (bVar1) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\t<file> : output file name\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandGenFsm( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_GenFsm( char * pFileName, int nIns, int nOuts, int nStates, int nLines, int ProbI, int ProbO );
    int c, nIns, nOuts, nStates, nLines, ProbI, ProbO, fVerbose;
    char * FileName;
    // set defaults
    nIns     =   30;
    nOuts    =    1;
    nStates  =   20;
    nLines   =  100;
    ProbI    =   10;
    ProbO    =  100;
    fVerbose =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "IOSLPQvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nIns = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nIns < 0 )
                goto usage;
            break;
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            nOuts = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOuts < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nStates = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nStates < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLines = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLines < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            ProbI = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( ProbI < 0 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            ProbO = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( ProbO < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( argc != globalUtilOptind + 1 )
    {
        goto usage;
    }
    if ( nIns < 1 || nStates < 1 || nLines < 1 || ProbI < 1 || ProbO < 1 )
    {
        Abc_Print( -1, "The number of inputs. states, lines, and probablity should be positive integers.\n" );
        goto usage;
    }
    // get the input file name
    FileName = argv[globalUtilOptind];
    Abc_GenFsm( FileName, nIns, nOuts, nStates, nLines, ProbI, ProbO );
    return 0;

usage:
    Abc_Print( -2, "usage: genfsm [-IOSLPQ num] [-vh] <file>\n" );
    Abc_Print( -2, "\t         generates random FSM in KISS format\n" );
    Abc_Print( -2, "\t-I num : the number of input variables [default = %d]\n", nIns );
    Abc_Print( -2, "\t-O num : the number of output variables [default = %d]\n", nOuts );
    Abc_Print( -2, "\t-S num : the number of state variables [default = %d]\n", nStates );
    Abc_Print( -2, "\t-L num : the number of lines (product terms) [default = %d]\n", nLines );
    Abc_Print( -2, "\t-P num : percentage propability of a variable present in the input cube [default = %d]\n", ProbI );
    Abc_Print( -2, "\t-Q num : percentage propability of a variable present in the output cube [default = %d]\n", ProbO );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : output file name\n");
    return 1;
}